

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> * __thiscall
immutable::ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>::operator=
          (ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *this,
          ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *r)

{
  ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> local_20;
  ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> temp;
  ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *r_local;
  ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *this_local;
  
  temp.ptr = (rrb<immutable::vector<char,_false,_6>,_true,_5> *)r;
  ref(&local_20,r);
  swap(this,&local_20);
  ~ref(&local_20);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }